

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sSpecialFloatTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Stress::SpecialFloatTests::init(SpecialFloatTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  TestNode *this_00;
  TestNode *this_01;
  VertexAttributeCase *pVVar2;
  TestNode *node;
  TextureCase *pTVar3;
  TextureSamplerCase *pTVar4;
  TestCaseGroup *framebufferGroup;
  TestCaseGroup *fragmentGroup;
  TestCaseGroup *vertexGroup;
  SpecialFloatTests *this_local;
  
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"vertex",
             "Run vertex shader with special float values");
  this_00 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this_00,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"fragment",
             "Run fragment shader with special float values");
  this_01 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this_01,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"framebuffer",
             "Test framebuffers containing special float values");
  pVVar2 = (VertexAttributeCase *)operator_new(0x98);
  Stress::anon_unknown_0::VertexAttributeCase::VertexAttributeCase
            (pVVar2,(this->super_TestCaseGroup).m_context,"attribute_buffer",
             "special attribute values in a buffer",STORAGE_BUFFER,TYPE_VERTEX);
  tcu::TestNode::addChild(pTVar1,(TestNode *)pVVar2);
  pVVar2 = (VertexAttributeCase *)operator_new(0x98);
  Stress::anon_unknown_0::VertexAttributeCase::VertexAttributeCase
            (pVVar2,(this->super_TestCaseGroup).m_context,"attribute_client",
             "special attribute values in a client storage",STORAGE_CLIENT,TYPE_VERTEX);
  tcu::TestNode::addChild(pTVar1,(TestNode *)pVVar2);
  node = (TestNode *)operator_new(0x88);
  Stress::anon_unknown_0::UniformCase::UniformCase
            ((UniformCase *)node,(this->super_TestCaseGroup).m_context,"uniform",
             "special uniform values",TYPE_VERTEX);
  tcu::TestNode::addChild(pTVar1,node);
  pTVar3 = (TextureCase *)operator_new(0x98);
  Stress::anon_unknown_0::TextureCase::TextureCase
            (pTVar3,(this->super_TestCaseGroup).m_context,"texture",
             "texture with special floating point values",TYPE_VERTEX,TEXTURE_FLOAT,UPLOAD_CLIENT);
  tcu::TestNode::addChild(pTVar1,(TestNode *)pTVar3);
  pTVar3 = (TextureCase *)operator_new(0x98);
  Stress::anon_unknown_0::TextureCase::TextureCase
            (pTVar3,(this->super_TestCaseGroup).m_context,"texture_pbo",
             "texture (via pbo) with special floating point values",TYPE_VERTEX,TEXTURE_FLOAT,
             UPLOAD_PBO);
  tcu::TestNode::addChild(pTVar1,(TestNode *)pTVar3);
  pTVar3 = (TextureCase *)operator_new(0x98);
  Stress::anon_unknown_0::TextureCase::TextureCase
            (pTVar3,(this->super_TestCaseGroup).m_context,"texture_shadow",
             "shadow texture with special floating point values",TYPE_VERTEX,TEXTURE_DEPTH,
             UPLOAD_CLIENT);
  tcu::TestNode::addChild(pTVar1,(TestNode *)pTVar3);
  pTVar4 = (TextureSamplerCase *)operator_new(0x90);
  Stress::anon_unknown_0::TextureSamplerCase::TextureSamplerCase
            (pTVar4,(this->super_TestCaseGroup).m_context,"sampler_tex_coord",
             "special texture coords",TYPE_VERTEX,TEST_TEX_COORD);
  tcu::TestNode::addChild(pTVar1,(TestNode *)pTVar4);
  pTVar4 = (TextureSamplerCase *)operator_new(0x90);
  Stress::anon_unknown_0::TextureSamplerCase::TextureSamplerCase
            (pTVar4,(this->super_TestCaseGroup).m_context,"sampler_tex_coord_cube",
             "special texture coords to cubemap",TYPE_VERTEX,TEST_TEX_COORD_CUBE);
  tcu::TestNode::addChild(pTVar1,(TestNode *)pTVar4);
  pTVar4 = (TextureSamplerCase *)operator_new(0x90);
  Stress::anon_unknown_0::TextureSamplerCase::TextureSamplerCase
            (pTVar4,(this->super_TestCaseGroup).m_context,"sampler_lod","special texture lod",
             TYPE_VERTEX,TEST_LOD);
  tcu::TestNode::addChild(pTVar1,(TestNode *)pTVar4);
  pTVar4 = (TextureSamplerCase *)operator_new(0x90);
  Stress::anon_unknown_0::TextureSamplerCase::TextureSamplerCase
            (pTVar4,(this->super_TestCaseGroup).m_context,"sampler_grad","special texture grad",
             TYPE_VERTEX,TEST_GRAD);
  tcu::TestNode::addChild(pTVar1,(TestNode *)pTVar4);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pVVar2 = (VertexAttributeCase *)operator_new(0x98);
  Stress::anon_unknown_0::VertexAttributeCase::VertexAttributeCase
            (pVVar2,(this->super_TestCaseGroup).m_context,"attribute_buffer",
             "special attribute values in a buffer",STORAGE_BUFFER,TYPE_FRAGMENT);
  tcu::TestNode::addChild(this_00,(TestNode *)pVVar2);
  pVVar2 = (VertexAttributeCase *)operator_new(0x98);
  Stress::anon_unknown_0::VertexAttributeCase::VertexAttributeCase
            (pVVar2,(this->super_TestCaseGroup).m_context,"attribute_client",
             "special attribute values in a client storage",STORAGE_CLIENT,TYPE_FRAGMENT);
  tcu::TestNode::addChild(this_00,(TestNode *)pVVar2);
  pTVar1 = (TestNode *)operator_new(0x88);
  Stress::anon_unknown_0::UniformCase::UniformCase
            ((UniformCase *)pTVar1,(this->super_TestCaseGroup).m_context,"uniform",
             "special uniform values",TYPE_FRAGMENT);
  tcu::TestNode::addChild(this_00,pTVar1);
  pTVar3 = (TextureCase *)operator_new(0x98);
  Stress::anon_unknown_0::TextureCase::TextureCase
            (pTVar3,(this->super_TestCaseGroup).m_context,"texture",
             "texture with special floating point values",TYPE_FRAGMENT,TEXTURE_FLOAT,UPLOAD_CLIENT)
  ;
  tcu::TestNode::addChild(this_00,(TestNode *)pTVar3);
  pTVar3 = (TextureCase *)operator_new(0x98);
  Stress::anon_unknown_0::TextureCase::TextureCase
            (pTVar3,(this->super_TestCaseGroup).m_context,"texture_pbo",
             "texture (via pbo) with special floating point values",TYPE_FRAGMENT,TEXTURE_FLOAT,
             UPLOAD_PBO);
  tcu::TestNode::addChild(this_00,(TestNode *)pTVar3);
  pTVar3 = (TextureCase *)operator_new(0x98);
  Stress::anon_unknown_0::TextureCase::TextureCase
            (pTVar3,(this->super_TestCaseGroup).m_context,"texture_shadow",
             "shadow texture with special floating point values",TYPE_FRAGMENT,TEXTURE_DEPTH,
             UPLOAD_CLIENT);
  tcu::TestNode::addChild(this_00,(TestNode *)pTVar3);
  pTVar4 = (TextureSamplerCase *)operator_new(0x90);
  Stress::anon_unknown_0::TextureSamplerCase::TextureSamplerCase
            (pTVar4,(this->super_TestCaseGroup).m_context,"sampler_tex_coord",
             "special texture coords",TYPE_FRAGMENT,TEST_TEX_COORD);
  tcu::TestNode::addChild(this_00,(TestNode *)pTVar4);
  pTVar4 = (TextureSamplerCase *)operator_new(0x90);
  Stress::anon_unknown_0::TextureSamplerCase::TextureSamplerCase
            (pTVar4,(this->super_TestCaseGroup).m_context,"sampler_tex_coord_cube",
             "special texture coords to cubemap",TYPE_FRAGMENT,TEST_TEX_COORD_CUBE);
  tcu::TestNode::addChild(this_00,(TestNode *)pTVar4);
  pTVar4 = (TextureSamplerCase *)operator_new(0x90);
  Stress::anon_unknown_0::TextureSamplerCase::TextureSamplerCase
            (pTVar4,(this->super_TestCaseGroup).m_context,"sampler_lod","special texture lod",
             TYPE_FRAGMENT,TEST_LOD);
  tcu::TestNode::addChild(this_00,(TestNode *)pTVar4);
  pTVar4 = (TextureSamplerCase *)operator_new(0x90);
  Stress::anon_unknown_0::TextureSamplerCase::TextureSamplerCase
            (pTVar4,(this->super_TestCaseGroup).m_context,"sampler_grad","special texture grad",
             TYPE_FRAGMENT,TEST_GRAD);
  tcu::TestNode::addChild(this_00,(TestNode *)pTVar4);
  tcu::TestNode::addChild((TestNode *)this,this_00);
  pTVar1 = (TestNode *)operator_new(0x90);
  Stress::anon_unknown_0::OutputCase::OutputCase
            ((OutputCase *)pTVar1,(this->super_TestCaseGroup).m_context,"write_default",
             "write special floating point values to default framebuffer",FBO_DEFAULT);
  tcu::TestNode::addChild(this_01,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x90);
  Stress::anon_unknown_0::OutputCase::OutputCase
            ((OutputCase *)pTVar1,(this->super_TestCaseGroup).m_context,"write_rgba4",
             "write special floating point values to RGBA4 framebuffer",FBO_RGBA4);
  tcu::TestNode::addChild(this_01,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x90);
  Stress::anon_unknown_0::OutputCase::OutputCase
            ((OutputCase *)pTVar1,(this->super_TestCaseGroup).m_context,"write_rgb5_a1",
             "write special floating point values to RGB5_A1 framebuffer",FBO_RGB5_A1);
  tcu::TestNode::addChild(this_01,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x90);
  Stress::anon_unknown_0::OutputCase::OutputCase
            ((OutputCase *)pTVar1,(this->super_TestCaseGroup).m_context,"write_rgb565",
             "write special floating point values to RGB565 framebuffer",FBO_RGB565);
  tcu::TestNode::addChild(this_01,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x90);
  Stress::anon_unknown_0::OutputCase::OutputCase
            ((OutputCase *)pTVar1,(this->super_TestCaseGroup).m_context,"write_rgba8",
             "write special floating point values to RGBA8 framebuffer",FBO_RGBA8);
  tcu::TestNode::addChild(this_01,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x90);
  Stress::anon_unknown_0::OutputCase::OutputCase
            ((OutputCase *)pTVar1,(this->super_TestCaseGroup).m_context,"write_rgb10_a2",
             "write special floating point values to RGB10_A2 framebuffer",FBO_RGB10_A2);
  tcu::TestNode::addChild(this_01,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x90);
  Stress::anon_unknown_0::OutputCase::OutputCase
            ((OutputCase *)pTVar1,(this->super_TestCaseGroup).m_context,"write_float16",
             "write special floating point values to float16 framebuffer",FBO_RGBA_FLOAT16);
  tcu::TestNode::addChild(this_01,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x90);
  Stress::anon_unknown_0::OutputCase::OutputCase
            ((OutputCase *)pTVar1,(this->super_TestCaseGroup).m_context,"write_float32",
             "write special floating point values to float32 framebuffer",FBO_RGBA_FLOAT32);
  tcu::TestNode::addChild(this_01,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x90);
  Stress::anon_unknown_0::BlendingCase::BlendingCase
            ((BlendingCase *)pTVar1,(this->super_TestCaseGroup).m_context,"blend_default",
             "blend special floating point values in a default framebuffer",FBO_DEFAULT);
  tcu::TestNode::addChild(this_01,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x90);
  Stress::anon_unknown_0::BlendingCase::BlendingCase
            ((BlendingCase *)pTVar1,(this->super_TestCaseGroup).m_context,"blend_rgba8",
             "blend special floating point values in a RGBA8 framebuffer",FBO_RGBA8);
  tcu::TestNode::addChild(this_01,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x90);
  Stress::anon_unknown_0::BlendingCase::BlendingCase
            ((BlendingCase *)pTVar1,(this->super_TestCaseGroup).m_context,"blend_float16",
             "blend special floating point values in a float16 framebuffer",FBO_RGBA_FLOAT16);
  tcu::TestNode::addChild(this_01,pTVar1);
  tcu::TestNode::addChild((TestNode *)this,this_01);
  return extraout_EAX;
}

Assistant:

void SpecialFloatTests::init (void)
{
	tcu::TestCaseGroup* const vertexGroup		= new tcu::TestCaseGroup(m_testCtx, "vertex",		"Run vertex shader with special float values");
	tcu::TestCaseGroup* const fragmentGroup		= new tcu::TestCaseGroup(m_testCtx, "fragment",		"Run fragment shader with special float values");
	tcu::TestCaseGroup* const framebufferGroup	= new tcu::TestCaseGroup(m_testCtx, "framebuffer",	"Test framebuffers containing special float values");

	// .vertex
	{
		vertexGroup->addChild(new VertexAttributeCase	(m_context, "attribute_buffer",			"special attribute values in a buffer",					VertexAttributeCase::STORAGE_BUFFER, VertexAttributeCase::TYPE_VERTEX));
		vertexGroup->addChild(new VertexAttributeCase	(m_context, "attribute_client",			"special attribute values in a client storage",			VertexAttributeCase::STORAGE_CLIENT, VertexAttributeCase::TYPE_VERTEX));
		vertexGroup->addChild(new UniformCase			(m_context, "uniform",					"special uniform values",								UniformCase::TYPE_VERTEX));
		vertexGroup->addChild(new TextureCase			(m_context, "texture",					"texture with special floating point values",			TextureCase::TYPE_VERTEX, TextureCase::TEXTURE_FLOAT, TextureCase::UPLOAD_CLIENT));
		vertexGroup->addChild(new TextureCase			(m_context, "texture_pbo",				"texture (via pbo) with special floating point values",	TextureCase::TYPE_VERTEX, TextureCase::TEXTURE_FLOAT, TextureCase::UPLOAD_PBO));
		vertexGroup->addChild(new TextureCase			(m_context, "texture_shadow",			"shadow texture with special floating point values",	TextureCase::TYPE_VERTEX, TextureCase::TEXTURE_DEPTH, TextureCase::UPLOAD_CLIENT));
		vertexGroup->addChild(new TextureSamplerCase	(m_context, "sampler_tex_coord",		"special texture coords",								TextureSamplerCase::TYPE_VERTEX, TextureSamplerCase::TEST_TEX_COORD));
		vertexGroup->addChild(new TextureSamplerCase	(m_context, "sampler_tex_coord_cube",	"special texture coords to cubemap",					TextureSamplerCase::TYPE_VERTEX, TextureSamplerCase::TEST_TEX_COORD_CUBE));
		vertexGroup->addChild(new TextureSamplerCase	(m_context, "sampler_lod",				"special texture lod",									TextureSamplerCase::TYPE_VERTEX, TextureSamplerCase::TEST_LOD));
		vertexGroup->addChild(new TextureSamplerCase	(m_context, "sampler_grad",				"special texture grad",									TextureSamplerCase::TYPE_VERTEX, TextureSamplerCase::TEST_GRAD));

		addChild(vertexGroup);
	}

	// .fragment
	{
		fragmentGroup->addChild(new VertexAttributeCase	(m_context, "attribute_buffer",			"special attribute values in a buffer",					VertexAttributeCase::STORAGE_BUFFER, VertexAttributeCase::TYPE_FRAGMENT));
		fragmentGroup->addChild(new VertexAttributeCase	(m_context, "attribute_client",			"special attribute values in a client storage",			VertexAttributeCase::STORAGE_CLIENT, VertexAttributeCase::TYPE_FRAGMENT));
		fragmentGroup->addChild(new UniformCase			(m_context, "uniform",					"special uniform values",								UniformCase::TYPE_FRAGMENT));
		fragmentGroup->addChild(new TextureCase			(m_context, "texture",					"texture with special floating point values",			TextureCase::TYPE_FRAGMENT, TextureCase::TEXTURE_FLOAT, TextureCase::UPLOAD_CLIENT));
		fragmentGroup->addChild(new TextureCase			(m_context, "texture_pbo",				"texture (via pbo) with special floating point values",	TextureCase::TYPE_FRAGMENT, TextureCase::TEXTURE_FLOAT, TextureCase::UPLOAD_PBO));
		fragmentGroup->addChild(new TextureCase			(m_context, "texture_shadow",			"shadow texture with special floating point values",	TextureCase::TYPE_FRAGMENT, TextureCase::TEXTURE_DEPTH, TextureCase::UPLOAD_CLIENT));
		fragmentGroup->addChild(new TextureSamplerCase	(m_context, "sampler_tex_coord",		"special texture coords",								TextureSamplerCase::TYPE_FRAGMENT, TextureSamplerCase::TEST_TEX_COORD));
		fragmentGroup->addChild(new TextureSamplerCase	(m_context, "sampler_tex_coord_cube",	"special texture coords to cubemap",					TextureSamplerCase::TYPE_FRAGMENT, TextureSamplerCase::TEST_TEX_COORD_CUBE));
		fragmentGroup->addChild(new TextureSamplerCase	(m_context, "sampler_lod",				"special texture lod",									TextureSamplerCase::TYPE_FRAGMENT, TextureSamplerCase::TEST_LOD));
		fragmentGroup->addChild(new TextureSamplerCase	(m_context, "sampler_grad",				"special texture grad",									TextureSamplerCase::TYPE_FRAGMENT, TextureSamplerCase::TEST_GRAD));

		addChild(fragmentGroup);
	}

	// .framebuffer
	{
		framebufferGroup->addChild(new OutputCase		(m_context, "write_default",			"write special floating point values to default framebuffer",	FramebufferRenderCase::FBO_DEFAULT));
		framebufferGroup->addChild(new OutputCase		(m_context, "write_rgba4",				"write special floating point values to RGBA4 framebuffer",		FramebufferRenderCase::FBO_RGBA4));
		framebufferGroup->addChild(new OutputCase		(m_context, "write_rgb5_a1",			"write special floating point values to RGB5_A1 framebuffer",	FramebufferRenderCase::FBO_RGB5_A1));
		framebufferGroup->addChild(new OutputCase		(m_context, "write_rgb565",				"write special floating point values to RGB565 framebuffer",	FramebufferRenderCase::FBO_RGB565));
		framebufferGroup->addChild(new OutputCase		(m_context, "write_rgba8",				"write special floating point values to RGBA8 framebuffer",		FramebufferRenderCase::FBO_RGBA8));
		framebufferGroup->addChild(new OutputCase		(m_context, "write_rgb10_a2",			"write special floating point values to RGB10_A2 framebuffer",	FramebufferRenderCase::FBO_RGB10_A2));
		framebufferGroup->addChild(new OutputCase		(m_context, "write_float16",			"write special floating point values to float16 framebuffer",	FramebufferRenderCase::FBO_RGBA_FLOAT16));
		framebufferGroup->addChild(new OutputCase		(m_context, "write_float32",			"write special floating point values to float32 framebuffer",	FramebufferRenderCase::FBO_RGBA_FLOAT32));

		framebufferGroup->addChild(new BlendingCase		(m_context, "blend_default",			"blend special floating point values in a default framebuffer",	FramebufferRenderCase::FBO_DEFAULT));
		framebufferGroup->addChild(new BlendingCase		(m_context, "blend_rgba8",				"blend special floating point values in a RGBA8 framebuffer",	FramebufferRenderCase::FBO_RGBA8));
		framebufferGroup->addChild(new BlendingCase		(m_context, "blend_float16",			"blend special floating point values in a float16 framebuffer",	FramebufferRenderCase::FBO_RGBA_FLOAT16));

		addChild(framebufferGroup);
	}
}